

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AtomVisitor.hpp
# Opt level: O0

void __thiscall
OpenMD::DefaultAtomVisitor::DefaultAtomVisitor(DefaultAtomVisitor *this,SimInfo *info)

{
  BaseAtomVisitor *in_RSI;
  undefined8 *in_RDI;
  SimInfo *in_stack_ffffffffffffffe8;
  
  BaseAtomVisitor::BaseAtomVisitor(in_RSI,in_stack_ffffffffffffffe8);
  *in_RDI = &PTR__DefaultAtomVisitor_00485ff8;
  std::__cxx11::string::operator=((string *)(in_RDI + 1),"DefaultAtomVisitor");
  return;
}

Assistant:

DefaultAtomVisitor(SimInfo* info) : BaseAtomVisitor(info) {
      visitorName = "DefaultAtomVisitor";
    }